

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void check_unknown_types<double>(double *value,char *types,char *param_3)

{
  bool bVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  uint __c;
  ostream *poVar5;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  char format_str [256];
  AssertionResult local_3c8;
  double *local_3b0;
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  double local_368 [3];
  undefined **local_350;
  undefined1 *local_348;
  long local_340;
  undefined8 local_338;
  undefined1 local_330 [504];
  char local_138 [264];
  
  __c = 0xffffff80;
  local_3b0 = value;
  do {
    pcVar2 = strchr(types,__c);
    if (((pcVar2 == (char *)0x0) && (pvVar3 = memchr(".0123456789}",__c,0xd), (char)__c != '\0')) &&
       (pvVar3 == (void *)0x0)) {
      safe_sprintf<256ul>((char (*) [256])local_138,"{0:10%c}",(ulong)__c);
      testing::AssertionSuccess();
      if (local_3c8.success_ == true) {
        std::__cxx11::string::string
                  ((string *)local_3a8,"invalid type specifier",(allocator *)&local_350);
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          sVar4 = strlen(local_138);
          local_368[0] = *local_3b0;
          local_340 = 0;
          local_350 = &PTR_grow_002a3c18;
          local_348 = local_330;
          local_338 = 500;
          format_str_00.size_ = sVar4;
          format_str_00.data_ = local_138;
          args.field_1.values_ =
               (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *)local_368;
          args.types_ = fmt::v5::
                        format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
                        ::TYPES;
          fmt::v5::
          vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((range)&local_350,format_str_00,args,(locale_ref)0x0);
          local_388[0] = local_378;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_388,local_348,local_348 + local_340);
          local_350 = &PTR_grow_002a3c18;
          if (local_348 != local_330) {
            operator_delete(local_348);
          }
          if (local_388[0] != local_378) {
            operator_delete(local_388[0]);
          }
        }
        testing::AssertionResult::operator<<
                  (&local_3c8,
                   (char (*) [107])
                   "Expected: format(format_str, value) throws an exception of type format_error.\n  Actual: it throws nothing."
                  );
        if (local_3a8[0] != local_398) {
          operator_delete(local_3a8[0]);
        }
      }
      testing::Message::Message((Message *)&local_350);
      poVar5 = (ostream *)(local_350 + 2);
      sVar4 = strlen(local_138);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_138,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_350 + 2)," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_350 + 2),"invalid type specifier",0x16);
      pcVar2 = "";
      if (local_3c8.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((local_3c8.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_3a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                 ,0x52e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)&local_350);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
      if (((local_350 != (undefined **)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_350 != (undefined **)0x0)) {
        (**(code **)(*local_350 + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_3c8.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    __c = __c + 1;
  } while (__c != 0x80);
  return;
}

Assistant:

void check_unknown_types(const T &value, const char *types, const char *) {
  char format_str[BUFFER_SIZE];
  const char *special = ".0123456789}";
  for (int i = CHAR_MIN; i <= CHAR_MAX; ++i) {
    char c = static_cast<char>(i);
    if (std::strchr(types, c) || std::strchr(special, c) || !c) continue;
    safe_sprintf(format_str, "{0:10%c}", c);
    const char *message = "invalid type specifier";
    EXPECT_THROW_MSG(format(format_str, value), format_error, message)
      << format_str << " " << message;
  }
}